

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd64.cpp
# Opt level: O2

void stackjit::Amd64Backend::divRegFromReg
               (CodeGen *codeGen,Registers dest,Registers src,bool is32bits)

{
  undefined8 in_RAX;
  undefined7 in_register_00000031;
  undefined8 uStack_18;
  
  if ((int)CONCAT71(in_register_00000031,dest) == 0) {
    uStack_18 = in_RAX;
    if (!is32bits) {
      uStack_18._0_7_ = (undefined7)in_RAX;
      uStack_18 = CONCAT17(0x48,(undefined7)uStack_18);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (codeGen,(uchar *)((long)&uStack_18 + 7));
    }
    uStack_18._0_7_ = CONCAT16(0xf7,(undefined6)uStack_18);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (codeGen,(uchar *)((long)&uStack_18 + 6));
    uStack_18 = CONCAT26(uStack_18._6_2_,CONCAT15(src,(undefined5)uStack_18)) | 0xf80000000000;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (codeGen,(uchar *)((long)&uStack_18 + 5));
    return;
  }
  __assert_fail("dest == Registers::AX && \"Only the AX register is supported as dest.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/svenslaggare[P]StackJIT/src/compiler/x64/amd64.cpp"
                ,0x42d,
                "void stackjit::Amd64Backend::divRegFromReg(CodeGen &, Registers, Registers, bool)")
  ;
}

Assistant:

void Amd64Backend::divRegFromReg(CodeGen& codeGen, Registers dest, Registers src, bool is32bits) {
	    assert(dest == Registers::AX && "Only the AX register is supported as dest.");

	    if (!is32bits) {
	        codeGen.push_back(0x48);
	    }

	    codeGen.push_back(0xf7);
	    codeGen.push_back(0xf8 | (Byte)src | ((Byte)dest << 3));
	}